

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O3

void __thiscall nv::DDSHeader::setFourCC(DDSHeader *this,uint8 c0,uint8 c1,uint8 c2,uint8 c3)

{
  uint uVar1;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined3 in_register_00000031;
  uint uVar2;
  
  (this->pf).flags = 4;
  uVar2 = (uint)c3 << 0x18 |
          (int)CONCAT71(in_register_00000009,c2) << 0x10 |
          (int)CONCAT71(in_register_00000011,c1) << 8 | CONCAT31(in_register_00000031,c0);
  uVar1 = 0x59583241;
  if (uVar2 != 0x32495441) {
    uVar1 = 0;
  }
  (this->pf).fourcc = uVar2;
  (this->pf).bitcount = uVar1;
  (this->pf).rmask = 0;
  (this->pf).gmask = 0;
  (this->pf).bmask = 0;
  (this->pf).amask = 0;
  return;
}

Assistant:

void DDSHeader::setFourCC(uint8 c0, uint8 c1, uint8 c2, uint8 c3)
{
	// set fourcc pixel format.
	this->pf.flags = DDPF_FOURCC;
	this->pf.fourcc = MAKEFOURCC(c0, c1, c2, c3);
	
	if (this->pf.fourcc == FOURCC_ATI2)
	{
		this->pf.bitcount = FOURCC_A2XY;
	}
	else
	{
		this->pf.bitcount = 0;
	}
	
	this->pf.rmask = 0;
	this->pf.gmask = 0;
	this->pf.bmask = 0;
	this->pf.amask = 0;
}